

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::BinaryOp_x86_avx512::forward_inplace
          (BinaryOp_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  _func_int *p_Var1;
  float fVar2;
  __m512 y;
  __m512 y_00;
  ulong uVar3;
  ulong uVar4;
  undefined1 (*pauVar5) [64];
  int iVar6;
  int iVar7;
  float *pfVar8;
  __m512 afVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  float fVar13;
  float afVar14 [2];
  float afVar16 [2];
  undefined8 uVar17;
  undefined8 uVar18;
  undefined1 auVar15 [16];
  float afVar19 [2];
  undefined8 uVar20;
  float afVar21 [2];
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 in_ZMM3 [64];
  __m128 afVar34;
  binary_op_rpow op_1;
  binary_op_ratan2 op;
  __m128 _b_1;
  __m128 _b;
  __m256 _b_avx;
  undefined1 in_stack_fffffffffffffe40 [24];
  undefined8 in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  float local_120 [2];
  float afStack_118 [2];
  float afStack_110 [2];
  float afStack_108 [2];
  float local_100 [2];
  float afStack_f8 [2];
  float afStack_f0 [2];
  float afStack_e8 [2];
  float afStack_e0 [2];
  float afStack_d8 [2];
  float afStack_d0 [2];
  float afStack_c8 [2];
  float local_c0 [2];
  float afStack_b8 [2];
  float afStack_b0 [2];
  float afStack_a8 [2];
  float afStack_a0 [2];
  float afStack_98 [2];
  float afStack_90 [2];
  float afStack_88 [22];
  
  p_Var1 = this->_vptr_BinaryOp_x86_avx512[-3];
  switch(*(undefined4 *)(&this->field_0xd0 + (long)p_Var1)) {
  case 0:
    auVar10 = vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xd8 + (long)p_Var1)));
    iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar4 = 0;
    uVar3 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar3 = uVar4;
    }
    for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
      pauVar5 = (undefined1 (*) [64])
                (bottom_top_blob->cstep * uVar4 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      for (iVar6 = 0; iVar6 + 0xf < iVar7; iVar6 = iVar6 + 0x10) {
        auVar11 = vaddps_avx512f(auVar10,*pauVar5);
        *pauVar5 = auVar11;
        pauVar5 = pauVar5 + 1;
      }
      while( true ) {
        fVar13 = auVar10._0_4_;
        if (iVar7 <= iVar6 + 7) break;
        auVar29._0_4_ = fVar13 + *(float *)*pauVar5;
        auVar29._4_4_ = auVar10._4_4_ + *(float *)(*pauVar5 + 4);
        auVar29._8_4_ = auVar10._8_4_ + *(float *)(*pauVar5 + 8);
        auVar29._12_4_ = auVar10._12_4_ + *(float *)(*pauVar5 + 0xc);
        auVar29._16_4_ = auVar10._16_4_ + *(float *)(*pauVar5 + 0x10);
        auVar29._20_4_ = auVar10._20_4_ + *(float *)(*pauVar5 + 0x14);
        auVar29._24_4_ = auVar10._24_4_ + *(float *)(*pauVar5 + 0x18);
        auVar29._28_4_ = auVar10._28_4_ + *(float *)(*pauVar5 + 0x1c);
        *(undefined1 (*) [32])*pauVar5 = auVar29;
        pauVar5 = (undefined1 (*) [64])(*pauVar5 + 0x20);
        iVar6 = iVar6 + 8;
      }
      for (; iVar6 + 3 < iVar7; iVar6 = iVar6 + 4) {
        auVar27._0_4_ = fVar13 + *(float *)*pauVar5;
        auVar27._4_4_ = auVar10._4_4_ + *(float *)(*pauVar5 + 4);
        auVar27._8_4_ = auVar10._8_4_ + *(float *)(*pauVar5 + 8);
        auVar27._12_4_ = auVar10._12_4_ + *(float *)(*pauVar5 + 0xc);
        *(undefined1 (*) [16])*pauVar5 = auVar27;
        pauVar5 = (undefined1 (*) [64])(*pauVar5 + 0x10);
      }
      for (; iVar6 < iVar7; iVar6 = iVar6 + 1) {
        *(float *)*pauVar5 = fVar13 + *(float *)*pauVar5;
        pauVar5 = (undefined1 (*) [64])(*pauVar5 + 4);
      }
    }
    break;
  case 1:
    auVar10 = vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xd8 + (long)p_Var1)));
    iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar4 = 0;
    uVar3 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar3 = uVar4;
    }
    for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
      pauVar5 = (undefined1 (*) [64])
                (bottom_top_blob->cstep * uVar4 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      for (iVar6 = 0; iVar6 + 0xf < iVar7; iVar6 = iVar6 + 0x10) {
        auVar11 = vsubps_avx512f(*pauVar5,auVar10);
        *pauVar5 = auVar11;
        pauVar5 = pauVar5 + 1;
      }
      for (; iVar6 + 7 < iVar7; iVar6 = iVar6 + 8) {
        auVar29 = vsubps_avx(*(undefined1 (*) [32])*pauVar5,auVar10._0_32_);
        *(undefined1 (*) [32])*pauVar5 = auVar29;
        pauVar5 = (undefined1 (*) [64])(*pauVar5 + 0x20);
      }
      for (; iVar6 + 3 < iVar7; iVar6 = iVar6 + 4) {
        auVar15 = vsubps_avx(*(undefined1 (*) [16])*pauVar5,auVar10._0_16_);
        *(undefined1 (*) [16])*pauVar5 = auVar15;
        pauVar5 = (undefined1 (*) [64])(*pauVar5 + 0x10);
      }
      for (; iVar6 < iVar7; iVar6 = iVar6 + 1) {
        *(float *)*pauVar5 = *(float *)*pauVar5 - auVar10._0_4_;
        pauVar5 = (undefined1 (*) [64])(*pauVar5 + 4);
      }
    }
    break;
  case 2:
    auVar10 = vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xd8 + (long)p_Var1)));
    iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar4 = 0;
    uVar3 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar3 = uVar4;
    }
    for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
      pauVar5 = (undefined1 (*) [64])
                (bottom_top_blob->cstep * uVar4 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      for (iVar6 = 0; iVar6 + 0xf < iVar7; iVar6 = iVar6 + 0x10) {
        in_ZMM1 = vmulps_avx512f(auVar10,*pauVar5);
        *pauVar5 = in_ZMM1;
        pauVar5 = pauVar5 + 1;
      }
      while( true ) {
        fVar13 = auVar10._0_4_;
        if (iVar7 <= iVar6 + 7) break;
        auVar30._0_4_ = fVar13 * *(float *)*pauVar5;
        auVar30._4_4_ = auVar10._4_4_ * *(float *)(*pauVar5 + 4);
        auVar30._8_4_ = auVar10._8_4_ * *(float *)(*pauVar5 + 8);
        auVar30._12_4_ = auVar10._12_4_ * *(float *)(*pauVar5 + 0xc);
        auVar30._16_4_ = auVar10._16_4_ * *(float *)(*pauVar5 + 0x10);
        auVar30._20_4_ = auVar10._20_4_ * *(float *)(*pauVar5 + 0x14);
        auVar30._28_36_ = in_ZMM1._28_36_;
        auVar30._24_4_ = auVar10._24_4_ * *(float *)(*pauVar5 + 0x18);
        in_ZMM1 = ZEXT3264(auVar30._0_32_);
        *(undefined1 (*) [32])*pauVar5 = auVar30._0_32_;
        pauVar5 = (undefined1 (*) [64])(*pauVar5 + 0x20);
        iVar6 = iVar6 + 8;
      }
      for (; iVar6 + 3 < iVar7; iVar6 = iVar6 + 4) {
        auVar28._0_4_ = fVar13 * *(float *)*pauVar5;
        auVar28._4_4_ = auVar10._4_4_ * *(float *)(*pauVar5 + 4);
        auVar28._8_4_ = auVar10._8_4_ * *(float *)(*pauVar5 + 8);
        auVar28._12_4_ = auVar10._12_4_ * *(float *)(*pauVar5 + 0xc);
        in_ZMM1 = ZEXT1664(auVar28);
        *(undefined1 (*) [16])*pauVar5 = auVar28;
        pauVar5 = (undefined1 (*) [64])(*pauVar5 + 0x10);
      }
      for (; iVar6 < iVar7; iVar6 = iVar6 + 1) {
        fVar2 = fVar13 * *(float *)*pauVar5;
        in_ZMM1 = ZEXT464((uint)fVar2);
        *(float *)*pauVar5 = fVar2;
        pauVar5 = (undefined1 (*) [64])(*pauVar5 + 4);
      }
    }
    break;
  case 3:
    iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    auVar15._0_4_ = 1.0 / *(float *)(&this->field_0xd8 + (long)p_Var1);
    auVar15._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar10 = vbroadcastss_avx512f(auVar15);
    uVar4 = 0;
    uVar3 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar3 = uVar4;
    }
    for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
      pauVar5 = (undefined1 (*) [64])
                (bottom_top_blob->cstep * uVar4 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      for (iVar6 = 0; iVar6 + 0xf < iVar7; iVar6 = iVar6 + 0x10) {
        in_ZMM2 = vmulps_avx512f(auVar10,*pauVar5);
        *pauVar5 = in_ZMM2;
        pauVar5 = pauVar5 + 1;
      }
      while( true ) {
        if (iVar7 <= iVar6 + 7) break;
        auVar12._0_4_ = auVar10._0_4_ * *(float *)*pauVar5;
        auVar12._4_4_ = auVar10._4_4_ * *(float *)(*pauVar5 + 4);
        auVar12._8_4_ = auVar10._8_4_ * *(float *)(*pauVar5 + 8);
        auVar12._12_4_ = auVar10._12_4_ * *(float *)(*pauVar5 + 0xc);
        auVar12._16_4_ = auVar10._16_4_ * *(float *)(*pauVar5 + 0x10);
        auVar12._20_4_ = auVar10._20_4_ * *(float *)(*pauVar5 + 0x14);
        auVar12._28_36_ = in_ZMM2._28_36_;
        auVar12._24_4_ = auVar10._24_4_ * *(float *)(*pauVar5 + 0x18);
        in_ZMM2 = ZEXT3264(auVar12._0_32_);
        *(undefined1 (*) [32])*pauVar5 = auVar12._0_32_;
        pauVar5 = (undefined1 (*) [64])(*pauVar5 + 0x20);
        iVar6 = iVar6 + 8;
      }
      for (; iVar6 + 3 < iVar7; iVar6 = iVar6 + 4) {
        auVar31._0_4_ = auVar10._0_4_ * *(float *)*pauVar5;
        auVar31._4_4_ = auVar10._4_4_ * *(float *)(*pauVar5 + 4);
        auVar31._8_4_ = auVar10._8_4_ * *(float *)(*pauVar5 + 8);
        auVar31._12_4_ = auVar10._12_4_ * *(float *)(*pauVar5 + 0xc);
        in_ZMM2 = ZEXT1664(auVar31);
        *(undefined1 (*) [16])*pauVar5 = auVar31;
        pauVar5 = (undefined1 (*) [64])(*pauVar5 + 0x10);
      }
      for (; iVar6 < iVar7; iVar6 = iVar6 + 1) {
        fVar13 = auVar15._0_4_ * *(float *)*pauVar5;
        in_ZMM2 = ZEXT464((uint)fVar13);
        *(float *)*pauVar5 = fVar13;
        pauVar5 = (undefined1 (*) [64])(*pauVar5 + 4);
      }
    }
    break;
  case 4:
    auVar10 = vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xd8 + (long)p_Var1)));
    iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar4 = 0;
    uVar3 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar3 = uVar4;
    }
    for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
      pauVar5 = (undefined1 (*) [64])
                (bottom_top_blob->cstep * uVar4 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      for (iVar6 = 0; iVar6 + 0xf < iVar7; iVar6 = iVar6 + 0x10) {
        auVar11 = vmaxps_avx512f(auVar10,*pauVar5);
        *pauVar5 = auVar11;
        pauVar5 = pauVar5 + 1;
      }
      for (; iVar6 + 7 < iVar7; iVar6 = iVar6 + 8) {
        auVar29 = vmaxps_avx(auVar10._0_32_,*(undefined1 (*) [32])*pauVar5);
        *(undefined1 (*) [32])*pauVar5 = auVar29;
        pauVar5 = (undefined1 (*) [64])(*pauVar5 + 0x20);
      }
      for (; iVar6 + 3 < iVar7; iVar6 = iVar6 + 4) {
        auVar15 = vmaxps_avx(auVar10._0_16_,*(undefined1 (*) [16])*pauVar5);
        *(undefined1 (*) [16])*pauVar5 = auVar15;
        pauVar5 = (undefined1 (*) [64])(*pauVar5 + 0x10);
      }
      for (; iVar6 < iVar7; iVar6 = iVar6 + 1) {
        auVar15 = vmaxss_avx(auVar10._0_16_,ZEXT416(*(uint *)*pauVar5));
        *(int *)*pauVar5 = auVar15._0_4_;
        pauVar5 = (undefined1 (*) [64])(*pauVar5 + 4);
      }
    }
    break;
  case 5:
    auVar10 = vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xd8 + (long)p_Var1)));
    iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar4 = 0;
    uVar3 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar3 = uVar4;
    }
    for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
      pauVar5 = (undefined1 (*) [64])
                (bottom_top_blob->cstep * uVar4 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      for (iVar6 = 0; iVar6 + 0xf < iVar7; iVar6 = iVar6 + 0x10) {
        auVar11 = vminps_avx512f(auVar10,*pauVar5);
        *pauVar5 = auVar11;
        pauVar5 = pauVar5 + 1;
      }
      for (; iVar6 + 7 < iVar7; iVar6 = iVar6 + 8) {
        auVar29 = vminps_avx(auVar10._0_32_,*(undefined1 (*) [32])*pauVar5);
        *(undefined1 (*) [32])*pauVar5 = auVar29;
        pauVar5 = (undefined1 (*) [64])(*pauVar5 + 0x20);
      }
      for (; iVar6 + 3 < iVar7; iVar6 = iVar6 + 4) {
        auVar15 = vminps_avx(auVar10._0_16_,*(undefined1 (*) [16])*pauVar5);
        *(undefined1 (*) [16])*pauVar5 = auVar15;
        pauVar5 = (undefined1 (*) [64])(*pauVar5 + 0x10);
      }
      for (; iVar6 < iVar7; iVar6 = iVar6 + 1) {
        auVar15 = vminss_avx(auVar10._0_16_,ZEXT416(*(uint *)*pauVar5));
        *(int *)*pauVar5 = auVar15._0_4_;
        pauVar5 = (undefined1 (*) [64])(*pauVar5 + 4);
      }
    }
    break;
  case 6:
    auVar10 = vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xd8 + (long)p_Var1)));
    iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar4 = 0;
    uVar3 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar3 = uVar4;
    }
    for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
      pfVar8 = (float *)(bottom_top_blob->cstep * uVar4 * bottom_top_blob->elemsize +
                        (long)bottom_top_blob->data);
      local_c0 = auVar10._0_8_;
      afStack_b8 = auVar10._8_8_;
      afStack_b0 = auVar10._16_8_;
      afStack_a8 = auVar10._24_8_;
      afStack_a0 = auVar10._32_8_;
      afStack_98 = auVar10._40_8_;
      afStack_90 = auVar10._48_8_;
      afStack_88._0_8_ = auVar10._56_8_;
      for (iVar6 = 0; iVar6 + 0xf < iVar7; iVar6 = iVar6 + 0x10) {
        uVar18 = *(undefined8 *)pfVar8;
        uVar17 = *(undefined8 *)(pfVar8 + 2);
        uVar20 = *(undefined8 *)(pfVar8 + 4);
        uVar22 = *(undefined8 *)(pfVar8 + 6);
        uVar23 = *(undefined8 *)(pfVar8 + 8);
        uVar24 = *(undefined8 *)(pfVar8 + 10);
        uVar25 = *(undefined8 *)(pfVar8 + 0xc);
        uVar26 = *(undefined8 *)(pfVar8 + 0xe);
        local_100 = (float  [2])uVar18;
        afStack_f8 = (float  [2])uVar17;
        afStack_f0 = (float  [2])uVar20;
        afStack_e8 = (float  [2])uVar22;
        afStack_e0 = (float  [2])uVar23;
        afStack_d8 = (float  [2])uVar24;
        afStack_d0 = (float  [2])uVar25;
        afStack_c8 = (float  [2])uVar26;
        BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                  ((binary_op_pow *)&stack0xfffffffffffffe57,(__m512 *)local_100,(__m512 *)local_c0)
        ;
        *(undefined8 *)pfVar8 = uVar18;
        *(undefined8 *)(pfVar8 + 2) = uVar17;
        *(undefined8 *)(pfVar8 + 4) = uVar20;
        *(undefined8 *)(pfVar8 + 6) = uVar22;
        *(undefined8 *)(pfVar8 + 8) = uVar23;
        *(undefined8 *)(pfVar8 + 10) = uVar24;
        *(undefined8 *)(pfVar8 + 0xc) = uVar25;
        *(undefined8 *)(pfVar8 + 0xe) = uVar26;
        pfVar8 = pfVar8 + 0x10;
      }
      local_100 = auVar10._0_8_;
      afStack_f8 = auVar10._8_8_;
      afStack_f0 = auVar10._16_8_;
      afStack_e8 = auVar10._24_8_;
      for (; iVar6 + 7 < iVar7; iVar6 = iVar6 + 8) {
        uVar18 = *(undefined8 *)pfVar8;
        uVar17 = *(undefined8 *)(pfVar8 + 2);
        uVar20 = *(undefined8 *)(pfVar8 + 4);
        uVar22 = *(undefined8 *)(pfVar8 + 6);
        local_120 = (float  [2])uVar18;
        afStack_118 = (float  [2])uVar17;
        afStack_110 = (float  [2])uVar20;
        afStack_108 = (float  [2])uVar22;
        BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                  ((binary_op_pow *)&stack0xfffffffffffffe57,(__m256 *)local_120,(__m256 *)local_100
                  );
        *(undefined8 *)pfVar8 = uVar18;
        *(undefined8 *)(pfVar8 + 2) = uVar17;
        *(undefined8 *)(pfVar8 + 4) = uVar20;
        *(undefined8 *)(pfVar8 + 6) = uVar22;
        pfVar8 = pfVar8 + 8;
      }
      local_120 = auVar10._0_8_;
      afStack_118 = auVar10._8_8_;
      for (; iVar6 + 3 < iVar7; iVar6 = iVar6 + 4) {
        uVar18 = *(undefined8 *)(pfVar8 + 2);
        afVar34 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                            ((binary_op_pow *)&stack0xfffffffffffffe57,
                             (__m128 *)&stack0xfffffffffffffe70,(__m128 *)local_120);
        *(long *)pfVar8 = afVar34._0_8_;
        *(undefined8 *)(pfVar8 + 2) = uVar18;
        pfVar8 = pfVar8 + 4;
      }
      for (; iVar6 < iVar7; iVar6 = iVar6 + 1) {
        fVar13 = powf(*pfVar8,auVar10._0_4_);
        *pfVar8 = fVar13;
        pfVar8 = pfVar8 + 1;
      }
    }
    break;
  case 7:
    auVar10 = vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xd8 + (long)p_Var1)));
    iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar4 = 0;
    uVar3 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar3 = uVar4;
    }
    for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
      pauVar5 = (undefined1 (*) [64])
                (bottom_top_blob->cstep * uVar4 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      for (iVar6 = 0; iVar6 + 0xf < iVar7; iVar6 = iVar6 + 0x10) {
        auVar11 = vsubps_avx512f(auVar10,*pauVar5);
        *pauVar5 = auVar11;
        pauVar5 = pauVar5 + 1;
      }
      for (; iVar6 + 7 < iVar7; iVar6 = iVar6 + 8) {
        auVar29 = vsubps_avx(auVar10._0_32_,*(undefined1 (*) [32])*pauVar5);
        *(undefined1 (*) [32])*pauVar5 = auVar29;
        pauVar5 = (undefined1 (*) [64])(*pauVar5 + 0x20);
      }
      for (; iVar6 + 3 < iVar7; iVar6 = iVar6 + 4) {
        auVar15 = vsubps_avx(auVar10._0_16_,*(undefined1 (*) [16])*pauVar5);
        *(undefined1 (*) [16])*pauVar5 = auVar15;
        pauVar5 = (undefined1 (*) [64])(*pauVar5 + 0x10);
      }
      for (; iVar6 < iVar7; iVar6 = iVar6 + 1) {
        *(float *)*pauVar5 = auVar10._0_4_ - *(float *)*pauVar5;
        pauVar5 = (undefined1 (*) [64])(*pauVar5 + 4);
      }
    }
    break;
  case 8:
    auVar10 = vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xd8 + (long)p_Var1)));
    iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar4 = 0;
    uVar3 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar3 = uVar4;
    }
    for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
      pauVar5 = (undefined1 (*) [64])
                (bottom_top_blob->cstep * uVar4 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      for (iVar6 = 0; iVar6 + 0xf < iVar7; iVar6 = iVar6 + 0x10) {
        auVar11 = vrcp14ps_avx512f(*pauVar5);
        in_ZMM3 = vmulps_avx512f(auVar10,auVar11);
        auVar12 = vfmsub213ps_avx512f(*pauVar5,in_ZMM3,auVar10);
        auVar11 = vfnmadd213ps_avx512f(auVar12,auVar11,in_ZMM3);
        *pauVar5 = auVar11;
        pauVar5 = pauVar5 + 1;
      }
      while( true ) {
        fVar13 = auVar10._0_4_;
        if (iVar7 <= iVar6 + 7) break;
        auVar29 = vrcpps_avx(*(undefined1 (*) [32])*pauVar5);
        auVar11._0_4_ = fVar13 * auVar29._0_4_;
        auVar11._4_4_ = auVar10._4_4_ * auVar29._4_4_;
        auVar11._8_4_ = auVar10._8_4_ * auVar29._8_4_;
        auVar11._12_4_ = auVar10._12_4_ * auVar29._12_4_;
        auVar11._16_4_ = auVar10._16_4_ * auVar29._16_4_;
        auVar11._20_4_ = auVar10._20_4_ * auVar29._20_4_;
        auVar11._28_36_ = in_ZMM3._28_36_;
        auVar11._24_4_ = auVar10._24_4_ * auVar29._24_4_;
        auVar33 = auVar11._0_32_;
        in_ZMM3 = ZEXT3264(auVar33);
        auVar15 = vfmsub213ps_fma(*(undefined1 (*) [32])*pauVar5,auVar33,auVar10._0_32_);
        auVar15 = vfnmadd213ps_fma(ZEXT1632(auVar15),auVar29,auVar33);
        *(undefined1 (*) [32])*pauVar5 = ZEXT1632(auVar15);
        pauVar5 = (undefined1 (*) [64])(*pauVar5 + 0x20);
        iVar6 = iVar6 + 8;
      }
      for (; iVar6 + 3 < iVar7; iVar6 = iVar6 + 4) {
        auVar15 = vrcpps_avx(*(undefined1 (*) [16])*pauVar5);
        auVar32._0_4_ = fVar13 * auVar15._0_4_;
        auVar32._4_4_ = auVar10._4_4_ * auVar15._4_4_;
        auVar32._8_4_ = auVar10._8_4_ * auVar15._8_4_;
        auVar32._12_4_ = auVar10._12_4_ * auVar15._12_4_;
        in_ZMM3 = ZEXT1664(auVar32);
        auVar31 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar5,auVar32,auVar10._0_16_);
        auVar15 = vfnmadd213ps_fma(auVar31,auVar15,auVar32);
        *(undefined1 (*) [16])*pauVar5 = auVar15;
        pauVar5 = (undefined1 (*) [64])(*pauVar5 + 0x10);
      }
      for (; iVar6 < iVar7; iVar6 = iVar6 + 1) {
        *(float *)*pauVar5 = fVar13 / *(float *)*pauVar5;
        pauVar5 = (undefined1 (*) [64])(*pauVar5 + 4);
      }
    }
    break;
  case 9:
    auVar10 = vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xd8 + (long)p_Var1)));
    iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar4 = 0;
    uVar3 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar3 = uVar4;
    }
    for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
      pfVar8 = (float *)(bottom_top_blob->cstep * uVar4 * bottom_top_blob->elemsize +
                        (long)bottom_top_blob->data);
      local_c0 = auVar10._0_8_;
      afStack_b8 = auVar10._8_8_;
      afStack_b0 = auVar10._16_8_;
      afStack_a8 = auVar10._24_8_;
      afStack_a0 = auVar10._32_8_;
      afStack_98 = auVar10._40_8_;
      afStack_90 = auVar10._48_8_;
      afStack_88._0_8_ = auVar10._56_8_;
      for (iVar6 = 0; iVar6 + 0xf < iVar7; iVar6 = iVar6 + 0x10) {
        uVar18 = *(undefined8 *)pfVar8;
        uVar17 = *(undefined8 *)(pfVar8 + 2);
        uVar20 = *(undefined8 *)(pfVar8 + 4);
        uVar22 = *(undefined8 *)(pfVar8 + 6);
        uVar23 = *(undefined8 *)(pfVar8 + 8);
        uVar24 = *(undefined8 *)(pfVar8 + 10);
        uVar25 = *(undefined8 *)(pfVar8 + 0xc);
        uVar26 = *(undefined8 *)(pfVar8 + 0xe);
        local_100 = (float  [2])uVar18;
        afStack_f8 = (float  [2])uVar17;
        afStack_f0 = (float  [2])uVar20;
        afStack_e8 = (float  [2])uVar22;
        afStack_e0 = (float  [2])uVar23;
        afStack_d8 = (float  [2])uVar24;
        afStack_d0 = (float  [2])uVar25;
        afStack_c8 = (float  [2])uVar26;
        BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack16
                  ((binary_op_rpow *)&stack0xfffffffffffffe57,(__m512 *)local_100,(__m512 *)local_c0
                  );
        *(undefined8 *)pfVar8 = uVar18;
        *(undefined8 *)(pfVar8 + 2) = uVar17;
        *(undefined8 *)(pfVar8 + 4) = uVar20;
        *(undefined8 *)(pfVar8 + 6) = uVar22;
        *(undefined8 *)(pfVar8 + 8) = uVar23;
        *(undefined8 *)(pfVar8 + 10) = uVar24;
        *(undefined8 *)(pfVar8 + 0xc) = uVar25;
        *(undefined8 *)(pfVar8 + 0xe) = uVar26;
        pfVar8 = pfVar8 + 0x10;
      }
      local_100 = auVar10._0_8_;
      afStack_f8 = auVar10._8_8_;
      afStack_f0 = auVar10._16_8_;
      afStack_e8 = auVar10._24_8_;
      for (; iVar6 + 7 < iVar7; iVar6 = iVar6 + 8) {
        uVar18 = *(undefined8 *)pfVar8;
        uVar17 = *(undefined8 *)(pfVar8 + 2);
        uVar20 = *(undefined8 *)(pfVar8 + 4);
        uVar22 = *(undefined8 *)(pfVar8 + 6);
        local_120 = (float  [2])uVar18;
        afStack_118 = (float  [2])uVar17;
        afStack_110 = (float  [2])uVar20;
        afStack_108 = (float  [2])uVar22;
        BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack8
                  ((binary_op_rpow *)&stack0xfffffffffffffe57,(__m256 *)local_120,
                   (__m256 *)local_100);
        *(undefined8 *)pfVar8 = uVar18;
        *(undefined8 *)(pfVar8 + 2) = uVar17;
        *(undefined8 *)(pfVar8 + 4) = uVar20;
        *(undefined8 *)(pfVar8 + 6) = uVar22;
        pfVar8 = pfVar8 + 8;
      }
      local_120 = auVar10._0_8_;
      afStack_118 = auVar10._8_8_;
      for (; iVar6 + 3 < iVar7; iVar6 = iVar6 + 4) {
        uVar18 = *(undefined8 *)(pfVar8 + 2);
        afVar34 = BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack4
                            ((binary_op_rpow *)&stack0xfffffffffffffe57,
                             (__m128 *)&stack0xfffffffffffffe70,(__m128 *)local_120);
        *(long *)pfVar8 = afVar34._0_8_;
        *(undefined8 *)(pfVar8 + 2) = uVar18;
        pfVar8 = pfVar8 + 4;
      }
      for (; iVar6 < iVar7; iVar6 = iVar6 + 1) {
        fVar13 = powf(auVar10._0_4_,*pfVar8);
        *pfVar8 = fVar13;
        pfVar8 = pfVar8 + 1;
      }
    }
    break;
  case 10:
    afVar9 = (__m512)vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xd8 + (long)p_Var1)));
    iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar4 = 0;
    uVar3 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar3 = uVar4;
    }
    for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
      pfVar8 = (float *)(bottom_top_blob->cstep * uVar4 * bottom_top_blob->elemsize +
                        (long)bottom_top_blob->data);
      for (iVar6 = 0; iVar6 + 0xf < iVar7; iVar6 = iVar6 + 0x10) {
        uVar18 = *(undefined8 *)pfVar8;
        uVar17 = *(undefined8 *)(pfVar8 + 2);
        uVar20 = *(undefined8 *)(pfVar8 + 4);
        uVar22 = *(undefined8 *)(pfVar8 + 6);
        uVar23 = *(undefined8 *)(pfVar8 + 8);
        uVar24 = *(undefined8 *)(pfVar8 + 10);
        uVar25 = *(undefined8 *)(pfVar8 + 0xc);
        uVar26 = *(undefined8 *)(pfVar8 + 0xe);
        y_00[6] = (float)(int)uVar3;
        y_00[7] = (float)(int)(uVar3 >> 0x20);
        y_00[0] = (float)in_stack_fffffffffffffe40._0_4_;
        y_00[1] = (float)in_stack_fffffffffffffe40._4_4_;
        y_00[2] = (float)in_stack_fffffffffffffe40._8_4_;
        y_00[3] = (float)in_stack_fffffffffffffe40._12_4_;
        y_00[4] = (float)in_stack_fffffffffffffe40._16_4_;
        y_00[5] = (float)in_stack_fffffffffffffe40._20_4_;
        y_00[8] = (float)(int)uVar4;
        y_00[9] = (float)(int)(uVar4 >> 0x20);
        y_00._40_8_ = bottom_top_blob;
        y_00[0xc] = (float)in_stack_fffffffffffffe70;
        y_00[0xd] = SUB84(in_stack_fffffffffffffe70,4);
        y_00[0xe] = (float)in_stack_fffffffffffffe78;
        y_00[0xf] = SUB84(in_stack_fffffffffffffe78,4);
        atan2512_ps((__m512 *)this,y_00,afVar9);
        *(undefined8 *)pfVar8 = uVar18;
        *(undefined8 *)(pfVar8 + 2) = uVar17;
        *(undefined8 *)(pfVar8 + 4) = uVar20;
        *(undefined8 *)(pfVar8 + 6) = uVar22;
        *(undefined8 *)(pfVar8 + 8) = uVar23;
        *(undefined8 *)(pfVar8 + 10) = uVar24;
        *(undefined8 *)(pfVar8 + 0xc) = uVar25;
        *(undefined8 *)(pfVar8 + 0xe) = uVar26;
        pfVar8 = pfVar8 + 0x10;
      }
      local_c0 = afVar9._0_8_;
      afStack_b8 = afVar9._8_8_;
      afStack_b0 = afVar9._16_8_;
      afStack_a8 = afVar9._24_8_;
      for (; iVar6 + 7 < iVar7; iVar6 = iVar6 + 8) {
        uVar18 = *(undefined8 *)pfVar8;
        uVar17 = *(undefined8 *)(pfVar8 + 2);
        uVar20 = *(undefined8 *)(pfVar8 + 4);
        uVar22 = *(undefined8 *)(pfVar8 + 6);
        this = (BinaryOp_x86_avx512 *)&stack0xfffffffffffffe70;
        local_100 = (float  [2])uVar18;
        afStack_f8 = (float  [2])uVar17;
        afStack_f0 = (float  [2])uVar20;
        afStack_e8 = (float  [2])uVar22;
        BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack8
                  ((binary_op_atan2 *)&stack0xfffffffffffffe70,(__m256 *)local_100,
                   (__m256 *)local_c0);
        *(undefined8 *)pfVar8 = uVar18;
        *(undefined8 *)(pfVar8 + 2) = uVar17;
        *(undefined8 *)(pfVar8 + 4) = uVar20;
        *(undefined8 *)(pfVar8 + 6) = uVar22;
        pfVar8 = pfVar8 + 8;
      }
      local_100 = afVar9._0_8_;
      afStack_f8 = afVar9._8_8_;
      for (; iVar6 + 3 < iVar7; iVar6 = iVar6 + 4) {
        local_120 = *(float (*) [2])pfVar8;
        uVar18 = *(undefined8 *)(pfVar8 + 2);
        this = (BinaryOp_x86_avx512 *)&stack0xfffffffffffffe70;
        afStack_118 = (float  [2])uVar18;
        afVar34 = BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack4
                            ((binary_op_atan2 *)&stack0xfffffffffffffe70,(__m128 *)local_120,
                             (__m128 *)local_100);
        *(long *)pfVar8 = afVar34._0_8_;
        *(undefined8 *)(pfVar8 + 2) = uVar18;
        pfVar8 = pfVar8 + 4;
      }
      for (; iVar6 < iVar7; iVar6 = iVar6 + 1) {
        fVar13 = atan2f(*pfVar8,afVar9[0]);
        *pfVar8 = fVar13;
        pfVar8 = pfVar8 + 1;
      }
    }
    break;
  case 0xb:
    afVar9 = (__m512)vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xd8 + (long)p_Var1)));
    iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar4 = 0;
    uVar3 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar3 = uVar4;
    }
    for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
      pfVar8 = (float *)(bottom_top_blob->cstep * uVar4 * bottom_top_blob->elemsize +
                        (long)bottom_top_blob->data);
      iVar6 = 0;
      while( true ) {
        afVar14 = afVar9._0_8_;
        afVar16 = afVar9._8_8_;
        afVar19 = afVar9._16_8_;
        afVar21 = afVar9._24_8_;
        if (iVar7 <= iVar6 + 0xf) break;
        uVar18 = afVar9._32_8_;
        uVar17 = afVar9._40_8_;
        uVar20 = afVar9._48_8_;
        uVar22 = afVar9._56_8_;
        y[6] = (float)(int)uVar3;
        y[7] = (float)(int)(uVar3 >> 0x20);
        y[0] = (float)in_stack_fffffffffffffe40._0_4_;
        y[1] = (float)in_stack_fffffffffffffe40._4_4_;
        y[2] = (float)in_stack_fffffffffffffe40._8_4_;
        y[3] = (float)in_stack_fffffffffffffe40._12_4_;
        y[4] = (float)in_stack_fffffffffffffe40._16_4_;
        y[5] = (float)in_stack_fffffffffffffe40._20_4_;
        y[8] = (float)(int)uVar4;
        y[9] = (float)(int)(uVar4 >> 0x20);
        y._40_8_ = bottom_top_blob;
        y[0xc] = (float)in_stack_fffffffffffffe70;
        y[0xd] = SUB84(in_stack_fffffffffffffe70,4);
        y[0xe] = (float)in_stack_fffffffffffffe78;
        y[0xf] = SUB84(in_stack_fffffffffffffe78,4);
        atan2512_ps((__m512 *)this,y,afVar9);
        *(float (*) [2])pfVar8 = afVar14;
        *(float (*) [2])(pfVar8 + 2) = afVar16;
        *(float (*) [2])(pfVar8 + 4) = afVar19;
        *(float (*) [2])(pfVar8 + 6) = afVar21;
        *(undefined8 *)(pfVar8 + 8) = uVar18;
        *(undefined8 *)(pfVar8 + 10) = uVar17;
        *(undefined8 *)(pfVar8 + 0xc) = uVar20;
        *(undefined8 *)(pfVar8 + 0xe) = uVar22;
        pfVar8 = pfVar8 + 0x10;
        iVar6 = iVar6 + 0x10;
      }
      for (; afStack_a8 = afVar21, afStack_b0 = afVar19, afStack_b8 = afVar16, local_c0 = afVar14,
          iVar6 + 7 < iVar7; iVar6 = iVar6 + 8) {
        uVar18 = *(undefined8 *)pfVar8;
        uVar17 = *(undefined8 *)(pfVar8 + 2);
        uVar20 = *(undefined8 *)(pfVar8 + 4);
        uVar22 = *(undefined8 *)(pfVar8 + 6);
        this = (BinaryOp_x86_avx512 *)&stack0xfffffffffffffe70;
        local_100 = (float  [2])uVar18;
        afStack_f8 = (float  [2])uVar17;
        afStack_f0 = (float  [2])uVar20;
        afStack_e8 = (float  [2])uVar22;
        BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack8
                  ((binary_op_ratan2 *)&stack0xfffffffffffffe70,(__m256 *)local_100,
                   (__m256 *)local_c0);
        *(undefined8 *)pfVar8 = uVar18;
        *(undefined8 *)(pfVar8 + 2) = uVar17;
        *(undefined8 *)(pfVar8 + 4) = uVar20;
        *(undefined8 *)(pfVar8 + 6) = uVar22;
        pfVar8 = pfVar8 + 8;
        afVar14 = local_c0;
        afVar16 = afStack_b8;
        afVar19 = afStack_b0;
        afVar21 = afStack_a8;
      }
      local_100 = afVar9._0_8_;
      afStack_f8 = afVar9._8_8_;
      for (; iVar6 + 3 < iVar7; iVar6 = iVar6 + 4) {
        local_120 = *(float (*) [2])pfVar8;
        uVar18 = *(undefined8 *)(pfVar8 + 2);
        this = (BinaryOp_x86_avx512 *)&stack0xfffffffffffffe70;
        afStack_118 = (float  [2])uVar18;
        afVar34 = BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack4
                            ((binary_op_ratan2 *)&stack0xfffffffffffffe70,(__m128 *)local_120,
                             (__m128 *)local_100);
        *(long *)pfVar8 = afVar34._0_8_;
        *(undefined8 *)(pfVar8 + 2) = uVar18;
        pfVar8 = pfVar8 + 4;
      }
      for (; iVar6 < iVar7; iVar6 = iVar6 + 1) {
        fVar13 = atan2f(afVar9[0],*pfVar8);
        *pfVar8 = fVar13;
        pfVar8 = pfVar8 + 1;
      }
    }
  }
  return 0;
}

Assistant:

int BinaryOp_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace BinaryOp_x86_avx512_functor;

    if (op_type == Operation_ADD) return binary_op_scalar_inplace<binary_op_add>(bottom_top_blob, b, opt);
    if (op_type == Operation_SUB) return binary_op_scalar_inplace<binary_op_sub>(bottom_top_blob, b, opt);
    if (op_type == Operation_MUL) return binary_op_scalar_inplace<binary_op_mul>(bottom_top_blob, b, opt);
    if (op_type == Operation_DIV) return binary_op_scalar_inplace<binary_op_div>(bottom_top_blob, b, opt);
    if (op_type == Operation_MAX) return binary_op_scalar_inplace<binary_op_max>(bottom_top_blob, b, opt);
    if (op_type == Operation_MIN) return binary_op_scalar_inplace<binary_op_min>(bottom_top_blob, b, opt);
    if (op_type == Operation_POW) return binary_op_scalar_inplace<binary_op_pow>(bottom_top_blob, b, opt);
    if (op_type == Operation_RSUB) return binary_op_scalar_inplace<binary_op_rsub>(bottom_top_blob, b, opt);
    if (op_type == Operation_RDIV) return binary_op_scalar_inplace<binary_op_rdiv>(bottom_top_blob, b, opt);
    if (op_type == Operation_RPOW) return binary_op_scalar_inplace<binary_op_rpow>(bottom_top_blob, b, opt);
    if (op_type == Operation_ATAN2) return binary_op_scalar_inplace<binary_op_atan2>(bottom_top_blob, b, opt);
    if (op_type == Operation_RATAN2) return binary_op_scalar_inplace<binary_op_ratan2>(bottom_top_blob, b, opt);

    return 0;
}